

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O2

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::show
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  long lVar1;
  long lVar2;
  word_wrapper __first;
  word_wrapper __last;
  anon_class_40_5_f37d82ab __f;
  size_t sVar3;
  ostream *poVar4;
  options_container *all;
  size_t sVar5;
  string *text;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  options_set *ops;
  _Base_ptr p_Var8;
  size_t max_width;
  long lVar9;
  bool is_first;
  bool is_overlong;
  size_t indent;
  czstring new_line;
  categories_collection categories;
  undefined5 in_stack_fffffffffffffe80;
  char cVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  allocator in_stack_fffffffffffffe87;
  option *this_00;
  long lVar13;
  char *pcVar14;
  undefined1 in_stack_fffffffffffffed8 [24];
  _Rb_tree_node_base *local_110;
  _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  local_f8;
  undefined1 local_c8 [56];
  undefined1 local_90 [56];
  anon_class_40_5_f37d82ab local_58;
  
  sVar3 = details::get_max_width();
  pcVar14 = "\n";
  poVar4 = std::operator<<(this->outs_,"OVERVIEW: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->overview_);
  std::operator<<(poVar4,"\n");
  usage(this);
  all = option::all_abi_cxx11_();
  details::build_categories((categories_collection *)&local_f8,&this->super_option,all);
  sVar5 = details::widest_option((categories_collection *)&local_f8);
  lVar13 = sVar5 + 3;
  max_width = (sVar3 - sVar5) - 5;
  p_Var7 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar3 = 0x7fffffff;
  if (sVar5 < 0x7fffffff) {
    sVar3 = sVar5;
  }
  do {
    if ((_Rb_tree_header *)p_Var7 == &local_f8._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
      ::~_Rb_tree(&local_f8);
      return;
    }
    poVar4 = std::operator<<(this->outs_,"\n");
    if (*(string **)(p_Var7 + 1) == (string *)0x0) {
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffed8,"OPTIONS",(allocator *)&stack0xfffffffffffffe87)
      ;
    }
    else {
      std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,*(string **)(p_Var7 + 1));
    }
    poVar4 = std::operator<<(poVar4,(string *)&stack0xfffffffffffffed8);
    std::operator<<(poVar4,":\n\n");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    details::get_switch_strings_abi_cxx11_
              ((switch_strings *)&stack0xfffffffffffffed8,(details *)&p_Var7[1]._M_parent,ops);
    for (p_Var6 = local_110; p_Var6 != (_Rb_tree_node_base *)&stack0xfffffffffffffee0;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      this_00 = *(option **)(p_Var6 + 1);
      cVar10 = '\x01';
      uVar12 = false;
      p_Var8 = p_Var6[3]._M_left;
      for (lVar9 = (long)p_Var6[1]._M_parent * 0x28; lVar9 != 0; lVar9 = lVar9 + -0x28) {
        if (cVar10 == '\0') {
          std::operator<<(this->outs_,"\n");
        }
        poVar4 = std::operator<<(this->outs_,"  ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
        *(size_t *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = sVar3;
        std::operator<<(poVar4,(string *)&p_Var8->_M_parent);
        cVar10 = '\0';
        sVar5 = utf::length((string *)&p_Var8->_M_parent);
        if (sVar5 != *(size_t *)p_Var8) {
          assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/help.hpp"
                        ,0xd6);
        }
        uVar12 = 0x14 < sVar5;
        p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent;
      }
      std::operator<<(this->outs_," - ");
      text = option::description_abi_cxx11_(this_00);
      uVar11 = 1;
      word_wrapper::word_wrapper((word_wrapper *)local_c8,text,max_width);
      word_wrapper::end((word_wrapper *)local_90,text,max_width);
      __first.max_width_ = (size_t)&stack0xfffffffffffffe86;
      __first.text_ = (string *)&stack0xfffffffffffffe85;
      __first.start_pos_ = (size_t)this;
      __first.substr_._M_dataplus._M_p = &stack0xfffffffffffffea8;
      __first.substr_._M_string_length = (size_type)&stack0xfffffffffffffea0;
      __first.substr_.field_2._M_allocated_capacity._0_5_ = in_stack_fffffffffffffe80;
      __first.substr_.field_2._M_local_buf[5] = uVar11;
      __first.substr_.field_2._M_local_buf[6] = uVar12;
      __first.substr_.field_2._M_local_buf[7] = (char)in_stack_fffffffffffffe87;
      __first.substr_.field_2._8_8_ = this_00;
      __last.max_width_ = (size_t)p_Var6;
      __last.text_ = (string *)max_width;
      __last.start_pos_ = lVar13;
      __last.substr_._M_dataplus._M_p = pcVar14;
      __last.substr_._M_string_length = (size_type)&stack0xfffffffffffffe85;
      __last.substr_.field_2._M_allocated_capacity = (size_type)&stack0xfffffffffffffe86;
      __last.substr_.field_2._8_8_ = this;
      __f.is_overlong = (bool *)&stack0xfffffffffffffea0;
      __f.is_first = (bool *)&stack0xfffffffffffffea8;
      __f.this = (help<std::basic_ostream<char,_std::char_traits<char>_>_> *)
                 in_stack_fffffffffffffed8._0_8_;
      __f.new_line = (czstring *)in_stack_fffffffffffffed8._8_8_;
      __f.indent = (size_t *)in_stack_fffffffffffffed8._16_8_;
      std::
      for_each<pstore::command_line::word_wrapper,pstore::command_line::help<std::ostream>::show()::_lambda(std::__cxx11::string_const&)_1_>
                (&local_58,__first,__last,__f);
      std::__cxx11::string::~string((string *)(local_90 + 0x18));
      std::__cxx11::string::~string((string *)(local_c8 + 0x18));
      std::operator<<(this->outs_,"\n");
    }
    std::
    _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
    ::~_Rb_tree((_Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
                 *)&stack0xfffffffffffffed8);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void help<OutputStream>::show () {
            static constexpr char const separator[] = " - ";
            static constexpr auto const separator_len = array_elements (separator) - 1U;

            std::size_t const max_width = details::get_max_width ();
            auto const new_line = ostream_traits::out_text ("\n");

            outs_ << ostream_traits::out_text ("OVERVIEW: ")
                  << ostream_traits::out_string (overview_) << new_line;
            usage ();

            auto const categories = details::build_categories (this, option::all ());
            std::size_t const max_name_len = widest_option (categories);

            auto const indent = max_name_len + separator_len;
            auto const description_width =
                max_width - max_name_len - separator_len - details::prefix_indent_len;

            for (auto const & cat : categories) {
                outs_ << new_line
                      << ostream_traits::out_string (cat.first == nullptr ? "OPTIONS"
                                                                          : cat.first->title ())
                      << ostream_traits::out_text (":\n\n");

                for (auto const & sw : details::get_switch_strings (cat.second)) {
                    option const * const op = sw.first;
                    auto is_first = true;
                    auto is_overlong = false;
                    for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                        if (!is_first) {
                            outs_ << new_line;
                        }
                        outs_ << details::prefix_indent << std::left
                              << std::setw (details::int_cast (max_name_len))
                              << ostream_traits::out_string (std::get<std::string> (name));

                        is_first = false;
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));
                        is_overlong = std::get<std::size_t> (name) > details::overlong_opt_max;
                    }
                    outs_ << separator;

                    std::string const & description = op->description ();
                    is_first = true;
                    std::for_each (word_wrapper (description, description_width),
                                   word_wrapper::end (description, description_width),
                                   [&] (std::string const & str) {
                                       if (!is_first || is_overlong) {
                                           outs_ << new_line
                                                 << std::setw (details::int_cast (
                                                        indent + details::prefix_indent_len))
                                                 << ' ';
                                       }
                                       outs_ << ostream_traits::out_string (str);
                                       is_first = false;
                                       is_overlong = false;
                                   });
                    outs_ << new_line;
                }
            }
        }